

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEventList.cpp
# Opt level: O2

void __thiscall smf::MidiEventList::MidiEventList(MidiEventList *this,MidiEventList *other)

{
  pointer ppMVar1;
  pointer ppMVar2;
  MidiEvent *in_RAX;
  MidiEvent *this_00;
  long lVar3;
  MidiEvent *local_38;
  
  (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = in_RAX;
  std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::reserve
            (&this->list,
             (long)(other->list).
                   super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(other->list).
                   super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  ppMVar1 = (other->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppMVar2 = (other->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (lVar3 = 0; (long)ppMVar2 - (long)ppMVar1 >> 3 != lVar3; lVar3 = lVar3 + 1) {
    this_00 = (MidiEvent *)operator_new(0x38);
    MidiEvent::MidiEvent(this_00,ppMVar1[lVar3]);
    local_38 = this_00;
    std::vector<smf::MidiEvent*,std::allocator<smf::MidiEvent*>>::emplace_back<smf::MidiEvent*>
              ((vector<smf::MidiEvent*,std::allocator<smf::MidiEvent*>> *)this,&local_38);
  }
  return;
}

Assistant:

MidiEventList::MidiEventList(const MidiEventList& other) {
	list.reserve(other.list.size());
	auto it = other.list.begin();
	std::generate_n(std::back_inserter(list), other.list.size(), [&]() -> MidiEvent* {
		return new MidiEvent(**it++);
	});
}